

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

void * __thiscall CorUnix::CPalThread::GetStackLimit(CPalThread *this)

{
  int iVar1;
  pthread_t __th;
  long in_FS_OFFSET;
  pthread_t thread;
  int status;
  size_t stackSize;
  void *stackLimit;
  CPalThread *this_local;
  pthread_attr_t attr;
  
  attr._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  stackLimit = this;
  __th = pthread_self();
  iVar1 = pthread_attr_init((pthread_attr_t *)&this_local);
  if (iVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","GetStackLimit",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x91c);
    fprintf(_stderr,"Expression: status == 0, Description: pthread_attr_init call failed");
  }
  iVar1 = pthread_getattr_np(__th,(pthread_attr_t *)&this_local);
  if (iVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","GetStackLimit",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x925);
    fprintf(_stderr,"Expression: status == 0, Description: pthread_getattr_np call failed");
  }
  iVar1 = pthread_attr_getstack
                    ((pthread_attr_t *)&this_local,(void **)&stackSize,
                     (size_t *)&stack0xffffffffffffffa0);
  if (iVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","GetStackLimit",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x928);
    fprintf(_stderr,"Expression: status == 0, Description: pthread_attr_getstack call failed");
  }
  iVar1 = pthread_attr_destroy((pthread_attr_t *)&this_local);
  if (iVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","GetStackLimit",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x92b);
    fprintf(_stderr,"Expression: status == 0, Description: pthread_attr_destroy call failed");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == attr._48_8_) {
    return (void *)stackSize;
  }
  __stack_chk_fail();
}

Assistant:

void *
CPalThread::GetStackLimit()
{
    void* stackLimit;
#ifdef __APPLE__
    // This is a Mac specific method
    stackLimit = ((BYTE *)pthread_get_stackaddr_np(pthread_self()) -
                   pthread_get_stacksize_np(pthread_self()));
#else
    pthread_attr_t attr;
    size_t stackSize;
    int status;

    pthread_t thread = pthread_self();

    status = pthread_attr_init(&attr);
    _ASSERT_MSG(status == 0, "pthread_attr_init call failed");

#if HAVE_PTHREAD_ATTR_GET_NP
    status = pthread_attr_get_np(thread, &attr);
#elif HAVE_PTHREAD_GETATTR_NP
    status = pthread_getattr_np(thread, &attr);
#else
#error Dont know how to get thread attributes on this platform!
#endif
    _ASSERT_MSG(status == 0, "pthread_getattr_np call failed");

    status = pthread_attr_getstack(&attr, &stackLimit, &stackSize);
    _ASSERT_MSG(status == 0, "pthread_attr_getstack call failed");

    status = pthread_attr_destroy(&attr);
    _ASSERT_MSG(status == 0, "pthread_attr_destroy call failed");
#endif

    return stackLimit;
}